

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack4.h
# Opt level: O0

void ncnn::convdw3x3s1_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  long lVar27;
  long lVar28;
  undefined8 *puVar29;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128 _r22_3;
  __m128 _r21_3;
  __m128 _r20_3;
  __m128 _r12_3;
  __m128 _r11_3;
  __m128 _r10_3;
  __m128 _r02_3;
  __m128 _r01_3;
  __m128 _r00_3;
  __m128 _sum0_3;
  __m128 _r23_2;
  __m128 _r13_2;
  __m128 _r03_2;
  __m128 _sum1_2;
  __m128 _r22_2;
  __m128 _r21_2;
  __m128 _r20_2;
  __m128 _r12_2;
  __m128 _r11_2;
  __m128 _r10_2;
  __m128 _r02_2;
  __m128 _r01_2;
  __m128 _r00_2;
  __m128 _sum0_2;
  __m128 _r25_1;
  __m128 _r15_1;
  __m128 _r05_1;
  __m128 _sum3_1;
  __m128 _r24_1;
  __m128 _r14_1;
  __m128 _r04_1;
  __m128 _sum2_1;
  __m128 _r23_1;
  __m128 _r13_1;
  __m128 _r03_1;
  __m128 _sum1_1;
  __m128 _r22_1;
  __m128 _r21_1;
  __m128 _r20_1;
  __m128 _r12_1;
  __m128 _r11_1;
  __m128 _r10_1;
  __m128 _r02_1;
  __m128 _r01_1;
  __m128 _r00_1;
  __m128 _sum0_1;
  __m128 _r29;
  __m128 _r19;
  __m128 _r09;
  __m128 _sum7;
  __m128 _r28;
  __m128 _r18;
  __m128 _r08;
  __m128 _sum6;
  __m128 _r27;
  __m128 _r17;
  __m128 _r07;
  __m128 _sum5;
  __m128 _r26;
  __m128 _r16;
  __m128 _r06;
  __m128 _sum4;
  __m128 _r25;
  __m128 _r15;
  __m128 _r05;
  __m128 _sum3;
  __m128 _r24;
  __m128 _r14;
  __m128 _r04;
  __m128 _sum2;
  __m128 _r23;
  __m128 _r13;
  __m128 _r03;
  __m128 _sum1;
  __m128 _r22;
  __m128 _r21;
  __m128 _r20;
  __m128 _r12;
  __m128 _r11;
  __m128 _r10;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  __m128 _sum0;
  int j;
  int i;
  __m128 _k22;
  __m128 _k21;
  __m128 _k20;
  __m128 _k12;
  __m128 _k11;
  __m128 _k10;
  __m128 _k02;
  __m128 _k01;
  __m128 _k00;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m128 _bias0;
  Mat out;
  int g;
  float *bias;
  int group;
  int outh;
  int outw;
  Mat *m;
  Mat *m_1;
  undefined8 local_4028;
  undefined8 uStack_4020;
  int local_3aa0;
  int local_3a9c;
  undefined8 *local_3a08;
  undefined8 *local_3a00;
  undefined8 *local_39f8;
  undefined8 *local_39a8;
  int local_3924;
  float local_3438;
  float fStack_3434;
  float fStack_3430;
  float fStack_342c;
  float local_33d8;
  float fStack_33d4;
  float fStack_33d0;
  float fStack_33cc;
  float local_3378;
  float fStack_3374;
  float fStack_3370;
  float fStack_336c;
  float local_3318;
  float fStack_3314;
  float fStack_3310;
  float fStack_330c;
  float local_32b8;
  float fStack_32b4;
  float fStack_32b0;
  float fStack_32ac;
  float local_3258;
  float fStack_3254;
  float fStack_3250;
  float fStack_324c;
  float local_31f8;
  float fStack_31f4;
  float fStack_31f0;
  float fStack_31ec;
  float local_3198;
  float fStack_3194;
  float fStack_3190;
  float fStack_318c;
  float local_3138;
  float fStack_3134;
  float fStack_3130;
  float fStack_312c;
  float local_30d8;
  float fStack_30d4;
  float fStack_30d0;
  float fStack_30cc;
  float local_2fb8;
  float fStack_2fb4;
  float fStack_2fb0;
  float fStack_2fac;
  float local_2e98;
  float fStack_2e94;
  float fStack_2e90;
  float fStack_2e8c;
  float local_2d78;
  float fStack_2d74;
  float fStack_2d70;
  float fStack_2d6c;
  float local_2d18;
  float fStack_2d14;
  float fStack_2d10;
  float fStack_2d0c;
  float local_2cb8;
  float fStack_2cb4;
  float fStack_2cb0;
  float fStack_2cac;
  float local_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float local_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float local_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float local_2b38;
  float fStack_2b34;
  float fStack_2b30;
  float fStack_2b2c;
  float local_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  float local_2a78;
  float fStack_2a74;
  float fStack_2a70;
  float fStack_2a6c;
  float local_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float local_28f8;
  float fStack_28f4;
  float fStack_28f0;
  float fStack_28ec;
  float local_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float local_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float local_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float local_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float local_2358;
  float fStack_2354;
  float fStack_2350;
  float fStack_234c;
  float local_2238;
  float fStack_2234;
  float fStack_2230;
  float fStack_222c;
  float local_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float local_1ff8;
  float fStack_1ff4;
  float fStack_1ff0;
  float fStack_1fec;
  float local_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  float local_1f38;
  float fStack_1f34;
  float fStack_1f30;
  float fStack_1f2c;
  float local_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float local_1e78;
  float fStack_1e74;
  float fStack_1e70;
  float fStack_1e6c;
  float local_1e18;
  float fStack_1e14;
  float fStack_1e10;
  float fStack_1e0c;
  float local_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  float local_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float local_1cf8;
  float fStack_1cf4;
  float fStack_1cf0;
  float fStack_1cec;
  float local_1c98;
  float fStack_1c94;
  float fStack_1c90;
  float fStack_1c8c;
  float local_1b78;
  float fStack_1b74;
  float fStack_1b70;
  float fStack_1b6c;
  float local_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  float local_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  float local_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float local_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float local_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float local_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float local_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  float local_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float local_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar27 = in_RSI[6];
  lVar28 = in_RDI[7];
  lVar2 = *in_RCX;
  for (local_3924 = 0; local_3924 < (int)lVar28; local_3924 = local_3924 + 1) {
    local_39a8 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_3924 * in_RSI[2]);
    if (lVar2 == 0) {
      local_4028 = 0;
      uStack_4020 = 0;
    }
    else {
      puVar29 = (undefined8 *)(lVar2 + (long)(local_3924 << 2) * 4);
      local_4028 = *puVar29;
      uStack_4020 = puVar29[1];
    }
    puVar29 = (undefined8 *)
              (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_3924 * in_RDX[2]);
    local_39f8 = (undefined8 *)(*in_RDI + in_RDI[8] * (long)local_3924 * in_RDI[2]);
    local_3a00 = (undefined8 *)((long)local_39f8 + (long)*(int *)((long)in_RDI + 0x2c) * in_RDI[2]);
    local_3a08 = (undefined8 *)
                 ((long)local_39f8 + (long)*(int *)((long)in_RDI + 0x2c) * 2 * in_RDI[2]);
    uVar3 = *puVar29;
    uVar4 = puVar29[1];
    uVar5 = puVar29[2];
    uVar6 = puVar29[3];
    uVar7 = puVar29[4];
    uVar8 = puVar29[5];
    uVar9 = puVar29[6];
    uVar10 = puVar29[7];
    uVar11 = puVar29[8];
    uVar12 = puVar29[9];
    uVar13 = puVar29[10];
    uVar14 = puVar29[0xb];
    uVar15 = puVar29[0xc];
    uVar16 = puVar29[0xd];
    uVar17 = puVar29[0xe];
    uVar18 = puVar29[0xf];
    uVar19 = puVar29[0x10];
    uVar20 = puVar29[0x11];
    for (local_3a9c = 0; local_3a9c < (int)lVar27; local_3a9c = local_3a9c + 1) {
      local_3aa0 = 0;
      while( true ) {
        local_1e8 = (float)uVar3;
        fStack_1e4 = (float)((ulong)uVar3 >> 0x20);
        fStack_1e0 = (float)uVar4;
        fStack_1dc = (float)((ulong)uVar4 >> 0x20);
        local_218 = (float)local_4028;
        fStack_214 = (float)((ulong)local_4028 >> 0x20);
        fStack_210 = (float)uStack_4020;
        fStack_20c = (float)((ulong)uStack_4020 >> 0x20);
        local_248 = (float)uVar5;
        fStack_244 = (float)((ulong)uVar5 >> 0x20);
        fStack_240 = (float)uVar6;
        fStack_23c = (float)((ulong)uVar6 >> 0x20);
        local_2a8 = (float)uVar7;
        fStack_2a4 = (float)((ulong)uVar7 >> 0x20);
        fStack_2a0 = (float)uVar8;
        fStack_29c = (float)((ulong)uVar8 >> 0x20);
        local_308 = (float)uVar9;
        fStack_304 = (float)((ulong)uVar9 >> 0x20);
        fStack_300 = (float)uVar10;
        fStack_2fc = (float)((ulong)uVar10 >> 0x20);
        local_368 = (float)uVar11;
        fStack_364 = (float)((ulong)uVar11 >> 0x20);
        fStack_360 = (float)uVar12;
        fStack_35c = (float)((ulong)uVar12 >> 0x20);
        local_3c8 = (float)uVar13;
        fStack_3c4 = (float)((ulong)uVar13 >> 0x20);
        fStack_3c0 = (float)uVar14;
        fStack_3bc = (float)((ulong)uVar14 >> 0x20);
        local_428 = (float)uVar15;
        fStack_424 = (float)((ulong)uVar15 >> 0x20);
        fStack_420 = (float)uVar16;
        fStack_41c = (float)((ulong)uVar16 >> 0x20);
        local_488 = (float)uVar17;
        fStack_484 = (float)((ulong)uVar17 >> 0x20);
        fStack_480 = (float)uVar18;
        fStack_47c = (float)((ulong)uVar18 >> 0x20);
        local_4e8 = (float)uVar19;
        fStack_4e4 = (float)((ulong)uVar19 >> 0x20);
        fStack_4e0 = (float)uVar20;
        fStack_4dc = (float)((ulong)uVar20 >> 0x20);
        if (iVar1 <= local_3aa0 + 7) break;
        local_1f8 = (float)*local_39f8;
        fStack_1f4 = (float)((ulong)*local_39f8 >> 0x20);
        fStack_1f0 = (float)local_39f8[1];
        fStack_1ec = (float)((ulong)local_39f8[1] >> 0x20);
        local_258 = (float)local_39f8[2];
        fStack_254 = (float)((ulong)local_39f8[2] >> 0x20);
        fStack_250 = (float)local_39f8[3];
        fStack_24c = (float)((ulong)local_39f8[3] >> 0x20);
        local_2b8 = (float)local_39f8[4];
        fStack_2b4 = (float)((ulong)local_39f8[4] >> 0x20);
        fStack_2b0 = (float)local_39f8[5];
        fStack_2ac = (float)((ulong)local_39f8[5] >> 0x20);
        local_318 = (float)*local_3a00;
        fStack_314 = (float)((ulong)*local_3a00 >> 0x20);
        fStack_310 = (float)local_3a00[1];
        fStack_30c = (float)((ulong)local_3a00[1] >> 0x20);
        local_378 = (float)local_3a00[2];
        fStack_374 = (float)((ulong)local_3a00[2] >> 0x20);
        fStack_370 = (float)local_3a00[3];
        fStack_36c = (float)((ulong)local_3a00[3] >> 0x20);
        local_3d8 = (float)local_3a00[4];
        fStack_3d4 = (float)((ulong)local_3a00[4] >> 0x20);
        fStack_3d0 = (float)local_3a00[5];
        fStack_3cc = (float)((ulong)local_3a00[5] >> 0x20);
        local_438 = (float)*local_3a08;
        fStack_434 = (float)((ulong)*local_3a08 >> 0x20);
        fStack_430 = (float)local_3a08[1];
        fStack_42c = (float)((ulong)local_3a08[1] >> 0x20);
        local_498 = (float)local_3a08[2];
        fStack_494 = (float)((ulong)local_3a08[2] >> 0x20);
        fStack_490 = (float)local_3a08[3];
        fStack_48c = (float)((ulong)local_3a08[3] >> 0x20);
        local_4f8 = (float)local_3a08[4];
        fStack_4f4 = (float)((ulong)local_3a08[4] >> 0x20);
        fStack_4f0 = (float)local_3a08[5];
        fStack_4ec = (float)((ulong)local_3a08[5] >> 0x20);
        uVar21 = local_39f8[6];
        uVar22 = local_39f8[7];
        uVar23 = local_3a00[6];
        uVar24 = local_3a00[7];
        uVar25 = local_3a08[6];
        uVar26 = local_3a08[7];
        *local_39a8 = CONCAT44(fStack_4e4 * fStack_4f4 +
                               fStack_484 * fStack_494 +
                               fStack_424 * fStack_434 +
                               fStack_3c4 * fStack_3d4 +
                               fStack_364 * fStack_374 +
                               fStack_304 * fStack_314 +
                               fStack_2a4 * fStack_2b4 +
                               fStack_244 * fStack_254 + fStack_1e4 * fStack_1f4 + fStack_214,
                               local_4e8 * local_4f8 +
                               local_488 * local_498 +
                               local_428 * local_438 +
                               local_3c8 * local_3d8 +
                               local_368 * local_378 +
                               local_308 * local_318 +
                               local_2a8 * local_2b8 +
                               local_248 * local_258 + local_1e8 * local_1f8 + local_218);
        local_39a8[1] =
             CONCAT44(fStack_4dc * fStack_4ec +
                      fStack_47c * fStack_48c +
                      fStack_41c * fStack_42c +
                      fStack_3bc * fStack_3cc +
                      fStack_35c * fStack_36c +
                      fStack_2fc * fStack_30c +
                      fStack_29c * fStack_2ac +
                      fStack_23c * fStack_24c + fStack_1dc * fStack_1ec + fStack_20c,
                      fStack_4e0 * fStack_4f0 +
                      fStack_480 * fStack_490 +
                      fStack_420 * fStack_430 +
                      fStack_3c0 * fStack_3d0 +
                      fStack_360 * fStack_370 +
                      fStack_300 * fStack_310 +
                      fStack_2a0 * fStack_2b0 +
                      fStack_240 * fStack_250 + fStack_1e0 * fStack_1f0 + fStack_210);
        local_618 = (float)uVar21;
        fStack_614 = (float)((ulong)uVar21 >> 0x20);
        fStack_610 = (float)uVar22;
        fStack_60c = (float)((ulong)uVar22 >> 0x20);
        local_738 = (float)uVar23;
        fStack_734 = (float)((ulong)uVar23 >> 0x20);
        fStack_730 = (float)uVar24;
        fStack_72c = (float)((ulong)uVar24 >> 0x20);
        local_858 = (float)uVar25;
        fStack_854 = (float)((ulong)uVar25 >> 0x20);
        fStack_850 = (float)uVar26;
        fStack_84c = (float)((ulong)uVar26 >> 0x20);
        uVar21 = local_39f8[8];
        uVar22 = local_39f8[9];
        uVar23 = local_3a00[8];
        uVar24 = local_3a00[9];
        uVar25 = local_3a08[8];
        uVar26 = local_3a08[9];
        local_39a8[2] =
             CONCAT44(fStack_4e4 * fStack_854 +
                      fStack_484 * fStack_4f4 +
                      fStack_424 * fStack_494 +
                      fStack_3c4 * fStack_734 +
                      fStack_364 * fStack_3d4 +
                      fStack_304 * fStack_374 +
                      fStack_2a4 * fStack_614 +
                      fStack_244 * fStack_2b4 + fStack_1e4 * fStack_254 + fStack_214,
                      local_4e8 * local_858 +
                      local_488 * local_4f8 +
                      local_428 * local_498 +
                      local_3c8 * local_738 +
                      local_368 * local_3d8 +
                      local_308 * local_378 +
                      local_2a8 * local_618 +
                      local_248 * local_2b8 + local_1e8 * local_258 + local_218);
        local_39a8[3] =
             CONCAT44(fStack_4dc * fStack_84c +
                      fStack_47c * fStack_4ec +
                      fStack_41c * fStack_48c +
                      fStack_3bc * fStack_72c +
                      fStack_35c * fStack_3cc +
                      fStack_2fc * fStack_36c +
                      fStack_29c * fStack_60c +
                      fStack_23c * fStack_2ac + fStack_1dc * fStack_24c + fStack_20c,
                      fStack_4e0 * fStack_850 +
                      fStack_480 * fStack_4f0 +
                      fStack_420 * fStack_490 +
                      fStack_3c0 * fStack_730 +
                      fStack_360 * fStack_3d0 +
                      fStack_300 * fStack_370 +
                      fStack_2a0 * fStack_610 +
                      fStack_240 * fStack_2b0 + fStack_1e0 * fStack_250 + fStack_210);
        local_978 = (float)uVar21;
        fStack_974 = (float)((ulong)uVar21 >> 0x20);
        fStack_970 = (float)uVar22;
        fStack_96c = (float)((ulong)uVar22 >> 0x20);
        local_a98 = (float)uVar23;
        fStack_a94 = (float)((ulong)uVar23 >> 0x20);
        fStack_a90 = (float)uVar24;
        fStack_a8c = (float)((ulong)uVar24 >> 0x20);
        local_bb8 = (float)uVar25;
        fStack_bb4 = (float)((ulong)uVar25 >> 0x20);
        fStack_bb0 = (float)uVar26;
        fStack_bac = (float)((ulong)uVar26 >> 0x20);
        uVar21 = local_39f8[10];
        uVar22 = local_39f8[0xb];
        uVar23 = local_3a00[10];
        uVar24 = local_3a00[0xb];
        uVar25 = local_3a08[10];
        uVar26 = local_3a08[0xb];
        local_39a8[4] =
             CONCAT44(fStack_4e4 * fStack_bb4 +
                      fStack_484 * fStack_854 +
                      fStack_424 * fStack_4f4 +
                      fStack_3c4 * fStack_a94 +
                      fStack_364 * fStack_734 +
                      fStack_304 * fStack_3d4 +
                      fStack_2a4 * fStack_974 +
                      fStack_244 * fStack_614 + fStack_1e4 * fStack_2b4 + fStack_214,
                      local_4e8 * local_bb8 +
                      local_488 * local_858 +
                      local_428 * local_4f8 +
                      local_3c8 * local_a98 +
                      local_368 * local_738 +
                      local_308 * local_3d8 +
                      local_2a8 * local_978 +
                      local_248 * local_618 + local_1e8 * local_2b8 + local_218);
        local_39a8[5] =
             CONCAT44(fStack_4dc * fStack_bac +
                      fStack_47c * fStack_84c +
                      fStack_41c * fStack_4ec +
                      fStack_3bc * fStack_a8c +
                      fStack_35c * fStack_72c +
                      fStack_2fc * fStack_3cc +
                      fStack_29c * fStack_96c +
                      fStack_23c * fStack_60c + fStack_1dc * fStack_2ac + fStack_20c,
                      fStack_4e0 * fStack_bb0 +
                      fStack_480 * fStack_850 +
                      fStack_420 * fStack_4f0 +
                      fStack_3c0 * fStack_a90 +
                      fStack_360 * fStack_730 +
                      fStack_300 * fStack_3d0 +
                      fStack_2a0 * fStack_970 +
                      fStack_240 * fStack_610 + fStack_1e0 * fStack_2b0 + fStack_210);
        local_cd8 = (float)uVar21;
        fStack_cd4 = (float)((ulong)uVar21 >> 0x20);
        fStack_cd0 = (float)uVar22;
        fStack_ccc = (float)((ulong)uVar22 >> 0x20);
        local_df8 = (float)uVar23;
        fStack_df4 = (float)((ulong)uVar23 >> 0x20);
        fStack_df0 = (float)uVar24;
        fStack_dec = (float)((ulong)uVar24 >> 0x20);
        local_f18 = (float)uVar25;
        fStack_f14 = (float)((ulong)uVar25 >> 0x20);
        fStack_f10 = (float)uVar26;
        fStack_f0c = (float)((ulong)uVar26 >> 0x20);
        uVar21 = local_39f8[0xc];
        uVar22 = local_39f8[0xd];
        uVar23 = local_3a00[0xc];
        uVar24 = local_3a00[0xd];
        uVar25 = local_3a08[0xc];
        uVar26 = local_3a08[0xd];
        local_39a8[6] =
             CONCAT44(fStack_4e4 * fStack_f14 +
                      fStack_484 * fStack_bb4 +
                      fStack_424 * fStack_854 +
                      fStack_3c4 * fStack_df4 +
                      fStack_364 * fStack_a94 +
                      fStack_304 * fStack_734 +
                      fStack_2a4 * fStack_cd4 +
                      fStack_244 * fStack_974 + fStack_1e4 * fStack_614 + fStack_214,
                      local_4e8 * local_f18 +
                      local_488 * local_bb8 +
                      local_428 * local_858 +
                      local_3c8 * local_df8 +
                      local_368 * local_a98 +
                      local_308 * local_738 +
                      local_2a8 * local_cd8 +
                      local_248 * local_978 + local_1e8 * local_618 + local_218);
        local_39a8[7] =
             CONCAT44(fStack_4dc * fStack_f0c +
                      fStack_47c * fStack_bac +
                      fStack_41c * fStack_84c +
                      fStack_3bc * fStack_dec +
                      fStack_35c * fStack_a8c +
                      fStack_2fc * fStack_72c +
                      fStack_29c * fStack_ccc +
                      fStack_23c * fStack_96c + fStack_1dc * fStack_60c + fStack_20c,
                      fStack_4e0 * fStack_f10 +
                      fStack_480 * fStack_bb0 +
                      fStack_420 * fStack_850 +
                      fStack_3c0 * fStack_df0 +
                      fStack_360 * fStack_a90 +
                      fStack_300 * fStack_730 +
                      fStack_2a0 * fStack_cd0 +
                      fStack_240 * fStack_970 + fStack_1e0 * fStack_610 + fStack_210);
        local_1038 = (float)uVar21;
        fStack_1034 = (float)((ulong)uVar21 >> 0x20);
        fStack_1030 = (float)uVar22;
        fStack_102c = (float)((ulong)uVar22 >> 0x20);
        local_1158 = (float)uVar23;
        fStack_1154 = (float)((ulong)uVar23 >> 0x20);
        fStack_1150 = (float)uVar24;
        fStack_114c = (float)((ulong)uVar24 >> 0x20);
        local_1278 = (float)uVar25;
        fStack_1274 = (float)((ulong)uVar25 >> 0x20);
        fStack_1270 = (float)uVar26;
        fStack_126c = (float)((ulong)uVar26 >> 0x20);
        uVar21 = local_39f8[0xe];
        uVar22 = local_39f8[0xf];
        uVar23 = local_3a00[0xe];
        uVar24 = local_3a00[0xf];
        uVar25 = local_3a08[0xe];
        uVar26 = local_3a08[0xf];
        local_39a8[8] =
             CONCAT44(fStack_4e4 * fStack_1274 +
                      fStack_484 * fStack_f14 +
                      fStack_424 * fStack_bb4 +
                      fStack_3c4 * fStack_1154 +
                      fStack_364 * fStack_df4 +
                      fStack_304 * fStack_a94 +
                      fStack_2a4 * fStack_1034 +
                      fStack_244 * fStack_cd4 + fStack_1e4 * fStack_974 + fStack_214,
                      local_4e8 * local_1278 +
                      local_488 * local_f18 +
                      local_428 * local_bb8 +
                      local_3c8 * local_1158 +
                      local_368 * local_df8 +
                      local_308 * local_a98 +
                      local_2a8 * local_1038 +
                      local_248 * local_cd8 + local_1e8 * local_978 + local_218);
        local_39a8[9] =
             CONCAT44(fStack_4dc * fStack_126c +
                      fStack_47c * fStack_f0c +
                      fStack_41c * fStack_bac +
                      fStack_3bc * fStack_114c +
                      fStack_35c * fStack_dec +
                      fStack_2fc * fStack_a8c +
                      fStack_29c * fStack_102c +
                      fStack_23c * fStack_ccc + fStack_1dc * fStack_96c + fStack_20c,
                      fStack_4e0 * fStack_1270 +
                      fStack_480 * fStack_f10 +
                      fStack_420 * fStack_bb0 +
                      fStack_3c0 * fStack_1150 +
                      fStack_360 * fStack_df0 +
                      fStack_300 * fStack_a90 +
                      fStack_2a0 * fStack_1030 +
                      fStack_240 * fStack_cd0 + fStack_1e0 * fStack_970 + fStack_210);
        local_1398 = (float)uVar21;
        fStack_1394 = (float)((ulong)uVar21 >> 0x20);
        fStack_1390 = (float)uVar22;
        fStack_138c = (float)((ulong)uVar22 >> 0x20);
        local_14b8 = (float)uVar23;
        fStack_14b4 = (float)((ulong)uVar23 >> 0x20);
        fStack_14b0 = (float)uVar24;
        fStack_14ac = (float)((ulong)uVar24 >> 0x20);
        local_15d8 = (float)uVar25;
        fStack_15d4 = (float)((ulong)uVar25 >> 0x20);
        fStack_15d0 = (float)uVar26;
        fStack_15cc = (float)((ulong)uVar26 >> 0x20);
        uVar21 = local_39f8[0x10];
        uVar22 = local_39f8[0x11];
        uVar23 = local_3a00[0x10];
        uVar24 = local_3a00[0x11];
        uVar25 = local_3a08[0x10];
        uVar26 = local_3a08[0x11];
        local_39a8[10] =
             CONCAT44(fStack_4e4 * fStack_15d4 +
                      fStack_484 * fStack_1274 +
                      fStack_424 * fStack_f14 +
                      fStack_3c4 * fStack_14b4 +
                      fStack_364 * fStack_1154 +
                      fStack_304 * fStack_df4 +
                      fStack_2a4 * fStack_1394 +
                      fStack_244 * fStack_1034 + fStack_1e4 * fStack_cd4 + fStack_214,
                      local_4e8 * local_15d8 +
                      local_488 * local_1278 +
                      local_428 * local_f18 +
                      local_3c8 * local_14b8 +
                      local_368 * local_1158 +
                      local_308 * local_df8 +
                      local_2a8 * local_1398 +
                      local_248 * local_1038 + local_1e8 * local_cd8 + local_218);
        local_39a8[0xb] =
             CONCAT44(fStack_4dc * fStack_15cc +
                      fStack_47c * fStack_126c +
                      fStack_41c * fStack_f0c +
                      fStack_3bc * fStack_14ac +
                      fStack_35c * fStack_114c +
                      fStack_2fc * fStack_dec +
                      fStack_29c * fStack_138c +
                      fStack_23c * fStack_102c + fStack_1dc * fStack_ccc + fStack_20c,
                      fStack_4e0 * fStack_15d0 +
                      fStack_480 * fStack_1270 +
                      fStack_420 * fStack_f10 +
                      fStack_3c0 * fStack_14b0 +
                      fStack_360 * fStack_1150 +
                      fStack_300 * fStack_df0 +
                      fStack_2a0 * fStack_1390 +
                      fStack_240 * fStack_1030 + fStack_1e0 * fStack_cd0 + fStack_210);
        local_16f8 = (float)uVar21;
        fStack_16f4 = (float)((ulong)uVar21 >> 0x20);
        fStack_16f0 = (float)uVar22;
        fStack_16ec = (float)((ulong)uVar22 >> 0x20);
        local_1818 = (float)uVar23;
        fStack_1814 = (float)((ulong)uVar23 >> 0x20);
        fStack_1810 = (float)uVar24;
        fStack_180c = (float)((ulong)uVar24 >> 0x20);
        local_1938 = (float)uVar25;
        fStack_1934 = (float)((ulong)uVar25 >> 0x20);
        fStack_1930 = (float)uVar26;
        fStack_192c = (float)((ulong)uVar26 >> 0x20);
        uVar21 = local_39f8[0x12];
        uVar22 = local_39f8[0x13];
        uVar23 = local_3a00[0x12];
        uVar24 = local_3a00[0x13];
        uVar25 = local_3a08[0x12];
        uVar26 = local_3a08[0x13];
        local_39a8[0xc] =
             CONCAT44(fStack_4e4 * fStack_1934 +
                      fStack_484 * fStack_15d4 +
                      fStack_424 * fStack_1274 +
                      fStack_3c4 * fStack_1814 +
                      fStack_364 * fStack_14b4 +
                      fStack_304 * fStack_1154 +
                      fStack_2a4 * fStack_16f4 +
                      fStack_244 * fStack_1394 + fStack_1e4 * fStack_1034 + fStack_214,
                      local_4e8 * local_1938 +
                      local_488 * local_15d8 +
                      local_428 * local_1278 +
                      local_3c8 * local_1818 +
                      local_368 * local_14b8 +
                      local_308 * local_1158 +
                      local_2a8 * local_16f8 +
                      local_248 * local_1398 + local_1e8 * local_1038 + local_218);
        local_39a8[0xd] =
             CONCAT44(fStack_4dc * fStack_192c +
                      fStack_47c * fStack_15cc +
                      fStack_41c * fStack_126c +
                      fStack_3bc * fStack_180c +
                      fStack_35c * fStack_14ac +
                      fStack_2fc * fStack_114c +
                      fStack_29c * fStack_16ec +
                      fStack_23c * fStack_138c + fStack_1dc * fStack_102c + fStack_20c,
                      fStack_4e0 * fStack_1930 +
                      fStack_480 * fStack_15d0 +
                      fStack_420 * fStack_1270 +
                      fStack_3c0 * fStack_1810 +
                      fStack_360 * fStack_14b0 +
                      fStack_300 * fStack_1150 +
                      fStack_2a0 * fStack_16f0 +
                      fStack_240 * fStack_1390 + fStack_1e0 * fStack_1030 + fStack_210);
        local_1a58 = (float)uVar21;
        fStack_1a54 = (float)((ulong)uVar21 >> 0x20);
        fStack_1a50 = (float)uVar22;
        fStack_1a4c = (float)((ulong)uVar22 >> 0x20);
        local_1b78 = (float)uVar23;
        fStack_1b74 = (float)((ulong)uVar23 >> 0x20);
        fStack_1b70 = (float)uVar24;
        fStack_1b6c = (float)((ulong)uVar24 >> 0x20);
        local_1c98 = (float)uVar25;
        fStack_1c94 = (float)((ulong)uVar25 >> 0x20);
        fStack_1c90 = (float)uVar26;
        fStack_1c8c = (float)((ulong)uVar26 >> 0x20);
        local_39a8[0xe] =
             CONCAT44(fStack_4e4 * fStack_1c94 +
                      fStack_484 * fStack_1934 +
                      fStack_424 * fStack_15d4 +
                      fStack_3c4 * fStack_1b74 +
                      fStack_364 * fStack_1814 +
                      fStack_304 * fStack_14b4 +
                      fStack_2a4 * fStack_1a54 +
                      fStack_244 * fStack_16f4 + fStack_1e4 * fStack_1394 + fStack_214,
                      local_4e8 * local_1c98 +
                      local_488 * local_1938 +
                      local_428 * local_15d8 +
                      local_3c8 * local_1b78 +
                      local_368 * local_1818 +
                      local_308 * local_14b8 +
                      local_2a8 * local_1a58 +
                      local_248 * local_16f8 + local_1e8 * local_1398 + local_218);
        local_39a8[0xf] =
             CONCAT44(fStack_4dc * fStack_1c8c +
                      fStack_47c * fStack_192c +
                      fStack_41c * fStack_15cc +
                      fStack_3bc * fStack_1b6c +
                      fStack_35c * fStack_180c +
                      fStack_2fc * fStack_14ac +
                      fStack_29c * fStack_1a4c +
                      fStack_23c * fStack_16ec + fStack_1dc * fStack_138c + fStack_20c,
                      fStack_4e0 * fStack_1c90 +
                      fStack_480 * fStack_1930 +
                      fStack_420 * fStack_15d0 +
                      fStack_3c0 * fStack_1b70 +
                      fStack_360 * fStack_1810 +
                      fStack_300 * fStack_14b0 +
                      fStack_2a0 * fStack_1a50 +
                      fStack_240 * fStack_16f0 + fStack_1e0 * fStack_1390 + fStack_210);
        local_39f8 = local_39f8 + 0x10;
        local_3a00 = local_3a00 + 0x10;
        local_3a08 = local_3a08 + 0x10;
        local_39a8 = local_39a8 + 0x10;
        local_3aa0 = local_3aa0 + 8;
      }
      for (; local_3aa0 + 3 < iVar1; local_3aa0 = local_3aa0 + 4) {
        local_1cf8 = (float)*local_39f8;
        fStack_1cf4 = (float)((ulong)*local_39f8 >> 0x20);
        fStack_1cf0 = (float)local_39f8[1];
        fStack_1cec = (float)((ulong)local_39f8[1] >> 0x20);
        local_1d58 = (float)local_39f8[2];
        fStack_1d54 = (float)((ulong)local_39f8[2] >> 0x20);
        fStack_1d50 = (float)local_39f8[3];
        fStack_1d4c = (float)((ulong)local_39f8[3] >> 0x20);
        local_1db8 = (float)local_39f8[4];
        fStack_1db4 = (float)((ulong)local_39f8[4] >> 0x20);
        fStack_1db0 = (float)local_39f8[5];
        fStack_1dac = (float)((ulong)local_39f8[5] >> 0x20);
        local_1e18 = (float)*local_3a00;
        fStack_1e14 = (float)((ulong)*local_3a00 >> 0x20);
        fStack_1e10 = (float)local_3a00[1];
        fStack_1e0c = (float)((ulong)local_3a00[1] >> 0x20);
        local_1e78 = (float)local_3a00[2];
        fStack_1e74 = (float)((ulong)local_3a00[2] >> 0x20);
        fStack_1e70 = (float)local_3a00[3];
        fStack_1e6c = (float)((ulong)local_3a00[3] >> 0x20);
        local_1ed8 = (float)local_3a00[4];
        fStack_1ed4 = (float)((ulong)local_3a00[4] >> 0x20);
        fStack_1ed0 = (float)local_3a00[5];
        fStack_1ecc = (float)((ulong)local_3a00[5] >> 0x20);
        local_1f38 = (float)*local_3a08;
        fStack_1f34 = (float)((ulong)*local_3a08 >> 0x20);
        fStack_1f30 = (float)local_3a08[1];
        fStack_1f2c = (float)((ulong)local_3a08[1] >> 0x20);
        local_1f98 = (float)local_3a08[2];
        fStack_1f94 = (float)((ulong)local_3a08[2] >> 0x20);
        fStack_1f90 = (float)local_3a08[3];
        fStack_1f8c = (float)((ulong)local_3a08[3] >> 0x20);
        local_1ff8 = (float)local_3a08[4];
        fStack_1ff4 = (float)((ulong)local_3a08[4] >> 0x20);
        fStack_1ff0 = (float)local_3a08[5];
        fStack_1fec = (float)((ulong)local_3a08[5] >> 0x20);
        uVar21 = local_39f8[6];
        uVar22 = local_39f8[7];
        uVar23 = local_3a00[6];
        uVar24 = local_3a00[7];
        uVar25 = local_3a08[6];
        uVar26 = local_3a08[7];
        *local_39a8 = CONCAT44(fStack_4e4 * fStack_1ff4 +
                               fStack_484 * fStack_1f94 +
                               fStack_424 * fStack_1f34 +
                               fStack_3c4 * fStack_1ed4 +
                               fStack_364 * fStack_1e74 +
                               fStack_304 * fStack_1e14 +
                               fStack_2a4 * fStack_1db4 +
                               fStack_244 * fStack_1d54 + fStack_1e4 * fStack_1cf4 + fStack_214,
                               local_4e8 * local_1ff8 +
                               local_488 * local_1f98 +
                               local_428 * local_1f38 +
                               local_3c8 * local_1ed8 +
                               local_368 * local_1e78 +
                               local_308 * local_1e18 +
                               local_2a8 * local_1db8 +
                               local_248 * local_1d58 + local_1e8 * local_1cf8 + local_218);
        local_39a8[1] =
             CONCAT44(fStack_4dc * fStack_1fec +
                      fStack_47c * fStack_1f8c +
                      fStack_41c * fStack_1f2c +
                      fStack_3bc * fStack_1ecc +
                      fStack_35c * fStack_1e6c +
                      fStack_2fc * fStack_1e0c +
                      fStack_29c * fStack_1dac +
                      fStack_23c * fStack_1d4c + fStack_1dc * fStack_1cec + fStack_20c,
                      fStack_4e0 * fStack_1ff0 +
                      fStack_480 * fStack_1f90 +
                      fStack_420 * fStack_1f30 +
                      fStack_3c0 * fStack_1ed0 +
                      fStack_360 * fStack_1e70 +
                      fStack_300 * fStack_1e10 +
                      fStack_2a0 * fStack_1db0 +
                      fStack_240 * fStack_1d50 + fStack_1e0 * fStack_1cf0 + fStack_210);
        local_2118 = (float)uVar21;
        fStack_2114 = (float)((ulong)uVar21 >> 0x20);
        fStack_2110 = (float)uVar22;
        fStack_210c = (float)((ulong)uVar22 >> 0x20);
        local_2238 = (float)uVar23;
        fStack_2234 = (float)((ulong)uVar23 >> 0x20);
        fStack_2230 = (float)uVar24;
        fStack_222c = (float)((ulong)uVar24 >> 0x20);
        local_2358 = (float)uVar25;
        fStack_2354 = (float)((ulong)uVar25 >> 0x20);
        fStack_2350 = (float)uVar26;
        fStack_234c = (float)((ulong)uVar26 >> 0x20);
        uVar21 = local_39f8[8];
        uVar22 = local_39f8[9];
        uVar23 = local_3a00[8];
        uVar24 = local_3a00[9];
        uVar25 = local_3a08[8];
        uVar26 = local_3a08[9];
        local_39a8[2] =
             CONCAT44(fStack_4e4 * fStack_2354 +
                      fStack_484 * fStack_1ff4 +
                      fStack_424 * fStack_1f94 +
                      fStack_3c4 * fStack_2234 +
                      fStack_364 * fStack_1ed4 +
                      fStack_304 * fStack_1e74 +
                      fStack_2a4 * fStack_2114 +
                      fStack_244 * fStack_1db4 + fStack_1e4 * fStack_1d54 + fStack_214,
                      local_4e8 * local_2358 +
                      local_488 * local_1ff8 +
                      local_428 * local_1f98 +
                      local_3c8 * local_2238 +
                      local_368 * local_1ed8 +
                      local_308 * local_1e78 +
                      local_2a8 * local_2118 +
                      local_248 * local_1db8 + local_1e8 * local_1d58 + local_218);
        local_39a8[3] =
             CONCAT44(fStack_4dc * fStack_234c +
                      fStack_47c * fStack_1fec +
                      fStack_41c * fStack_1f8c +
                      fStack_3bc * fStack_222c +
                      fStack_35c * fStack_1ecc +
                      fStack_2fc * fStack_1e6c +
                      fStack_29c * fStack_210c +
                      fStack_23c * fStack_1dac + fStack_1dc * fStack_1d4c + fStack_20c,
                      fStack_4e0 * fStack_2350 +
                      fStack_480 * fStack_1ff0 +
                      fStack_420 * fStack_1f90 +
                      fStack_3c0 * fStack_2230 +
                      fStack_360 * fStack_1ed0 +
                      fStack_300 * fStack_1e70 +
                      fStack_2a0 * fStack_2110 +
                      fStack_240 * fStack_1db0 + fStack_1e0 * fStack_1d50 + fStack_210);
        local_2478 = (float)uVar21;
        fStack_2474 = (float)((ulong)uVar21 >> 0x20);
        fStack_2470 = (float)uVar22;
        fStack_246c = (float)((ulong)uVar22 >> 0x20);
        local_2598 = (float)uVar23;
        fStack_2594 = (float)((ulong)uVar23 >> 0x20);
        fStack_2590 = (float)uVar24;
        fStack_258c = (float)((ulong)uVar24 >> 0x20);
        local_26b8 = (float)uVar25;
        fStack_26b4 = (float)((ulong)uVar25 >> 0x20);
        fStack_26b0 = (float)uVar26;
        fStack_26ac = (float)((ulong)uVar26 >> 0x20);
        uVar21 = local_39f8[10];
        uVar22 = local_39f8[0xb];
        uVar23 = local_3a00[10];
        uVar24 = local_3a00[0xb];
        uVar25 = local_3a08[10];
        uVar26 = local_3a08[0xb];
        local_39a8[4] =
             CONCAT44(fStack_4e4 * fStack_26b4 +
                      fStack_484 * fStack_2354 +
                      fStack_424 * fStack_1ff4 +
                      fStack_3c4 * fStack_2594 +
                      fStack_364 * fStack_2234 +
                      fStack_304 * fStack_1ed4 +
                      fStack_2a4 * fStack_2474 +
                      fStack_244 * fStack_2114 + fStack_1e4 * fStack_1db4 + fStack_214,
                      local_4e8 * local_26b8 +
                      local_488 * local_2358 +
                      local_428 * local_1ff8 +
                      local_3c8 * local_2598 +
                      local_368 * local_2238 +
                      local_308 * local_1ed8 +
                      local_2a8 * local_2478 +
                      local_248 * local_2118 + local_1e8 * local_1db8 + local_218);
        local_39a8[5] =
             CONCAT44(fStack_4dc * fStack_26ac +
                      fStack_47c * fStack_234c +
                      fStack_41c * fStack_1fec +
                      fStack_3bc * fStack_258c +
                      fStack_35c * fStack_222c +
                      fStack_2fc * fStack_1ecc +
                      fStack_29c * fStack_246c +
                      fStack_23c * fStack_210c + fStack_1dc * fStack_1dac + fStack_20c,
                      fStack_4e0 * fStack_26b0 +
                      fStack_480 * fStack_2350 +
                      fStack_420 * fStack_1ff0 +
                      fStack_3c0 * fStack_2590 +
                      fStack_360 * fStack_2230 +
                      fStack_300 * fStack_1ed0 +
                      fStack_2a0 * fStack_2470 +
                      fStack_240 * fStack_2110 + fStack_1e0 * fStack_1db0 + fStack_210);
        local_27d8 = (float)uVar21;
        fStack_27d4 = (float)((ulong)uVar21 >> 0x20);
        fStack_27d0 = (float)uVar22;
        fStack_27cc = (float)((ulong)uVar22 >> 0x20);
        local_28f8 = (float)uVar23;
        fStack_28f4 = (float)((ulong)uVar23 >> 0x20);
        fStack_28f0 = (float)uVar24;
        fStack_28ec = (float)((ulong)uVar24 >> 0x20);
        local_2a18 = (float)uVar25;
        fStack_2a14 = (float)((ulong)uVar25 >> 0x20);
        fStack_2a10 = (float)uVar26;
        fStack_2a0c = (float)((ulong)uVar26 >> 0x20);
        local_39a8[6] =
             CONCAT44(fStack_4e4 * fStack_2a14 +
                      fStack_484 * fStack_26b4 +
                      fStack_424 * fStack_2354 +
                      fStack_3c4 * fStack_28f4 +
                      fStack_364 * fStack_2594 +
                      fStack_304 * fStack_2234 +
                      fStack_2a4 * fStack_27d4 +
                      fStack_244 * fStack_2474 + fStack_1e4 * fStack_2114 + fStack_214,
                      local_4e8 * local_2a18 +
                      local_488 * local_26b8 +
                      local_428 * local_2358 +
                      local_3c8 * local_28f8 +
                      local_368 * local_2598 +
                      local_308 * local_2238 +
                      local_2a8 * local_27d8 +
                      local_248 * local_2478 + local_1e8 * local_2118 + local_218);
        local_39a8[7] =
             CONCAT44(fStack_4dc * fStack_2a0c +
                      fStack_47c * fStack_26ac +
                      fStack_41c * fStack_234c +
                      fStack_3bc * fStack_28ec +
                      fStack_35c * fStack_258c +
                      fStack_2fc * fStack_222c +
                      fStack_29c * fStack_27cc +
                      fStack_23c * fStack_246c + fStack_1dc * fStack_210c + fStack_20c,
                      fStack_4e0 * fStack_2a10 +
                      fStack_480 * fStack_26b0 +
                      fStack_420 * fStack_2350 +
                      fStack_3c0 * fStack_28f0 +
                      fStack_360 * fStack_2590 +
                      fStack_300 * fStack_2230 +
                      fStack_2a0 * fStack_27d0 +
                      fStack_240 * fStack_2470 + fStack_1e0 * fStack_2110 + fStack_210);
        local_39f8 = local_39f8 + 8;
        local_3a00 = local_3a00 + 8;
        local_3a08 = local_3a08 + 8;
        local_39a8 = local_39a8 + 8;
      }
      for (; local_3aa0 + 1 < iVar1; local_3aa0 = local_3aa0 + 2) {
        local_2a78 = (float)*local_39f8;
        fStack_2a74 = (float)((ulong)*local_39f8 >> 0x20);
        fStack_2a70 = (float)local_39f8[1];
        fStack_2a6c = (float)((ulong)local_39f8[1] >> 0x20);
        local_2ad8 = (float)local_39f8[2];
        fStack_2ad4 = (float)((ulong)local_39f8[2] >> 0x20);
        fStack_2ad0 = (float)local_39f8[3];
        fStack_2acc = (float)((ulong)local_39f8[3] >> 0x20);
        local_2b38 = (float)local_39f8[4];
        fStack_2b34 = (float)((ulong)local_39f8[4] >> 0x20);
        fStack_2b30 = (float)local_39f8[5];
        fStack_2b2c = (float)((ulong)local_39f8[5] >> 0x20);
        local_2b98 = (float)*local_3a00;
        fStack_2b94 = (float)((ulong)*local_3a00 >> 0x20);
        fStack_2b90 = (float)local_3a00[1];
        fStack_2b8c = (float)((ulong)local_3a00[1] >> 0x20);
        local_2bf8 = (float)local_3a00[2];
        fStack_2bf4 = (float)((ulong)local_3a00[2] >> 0x20);
        fStack_2bf0 = (float)local_3a00[3];
        fStack_2bec = (float)((ulong)local_3a00[3] >> 0x20);
        local_2c58 = (float)local_3a00[4];
        fStack_2c54 = (float)((ulong)local_3a00[4] >> 0x20);
        fStack_2c50 = (float)local_3a00[5];
        fStack_2c4c = (float)((ulong)local_3a00[5] >> 0x20);
        local_2cb8 = (float)*local_3a08;
        fStack_2cb4 = (float)((ulong)*local_3a08 >> 0x20);
        fStack_2cb0 = (float)local_3a08[1];
        fStack_2cac = (float)((ulong)local_3a08[1] >> 0x20);
        local_2d18 = (float)local_3a08[2];
        fStack_2d14 = (float)((ulong)local_3a08[2] >> 0x20);
        fStack_2d10 = (float)local_3a08[3];
        fStack_2d0c = (float)((ulong)local_3a08[3] >> 0x20);
        local_2d78 = (float)local_3a08[4];
        fStack_2d74 = (float)((ulong)local_3a08[4] >> 0x20);
        fStack_2d70 = (float)local_3a08[5];
        fStack_2d6c = (float)((ulong)local_3a08[5] >> 0x20);
        uVar21 = local_39f8[6];
        uVar22 = local_39f8[7];
        uVar23 = local_3a00[6];
        uVar24 = local_3a00[7];
        uVar25 = local_3a08[6];
        uVar26 = local_3a08[7];
        *local_39a8 = CONCAT44(fStack_4e4 * fStack_2d74 +
                               fStack_484 * fStack_2d14 +
                               fStack_424 * fStack_2cb4 +
                               fStack_3c4 * fStack_2c54 +
                               fStack_364 * fStack_2bf4 +
                               fStack_304 * fStack_2b94 +
                               fStack_2a4 * fStack_2b34 +
                               fStack_244 * fStack_2ad4 + fStack_1e4 * fStack_2a74 + fStack_214,
                               local_4e8 * local_2d78 +
                               local_488 * local_2d18 +
                               local_428 * local_2cb8 +
                               local_3c8 * local_2c58 +
                               local_368 * local_2bf8 +
                               local_308 * local_2b98 +
                               local_2a8 * local_2b38 +
                               local_248 * local_2ad8 + local_1e8 * local_2a78 + local_218);
        local_39a8[1] =
             CONCAT44(fStack_4dc * fStack_2d6c +
                      fStack_47c * fStack_2d0c +
                      fStack_41c * fStack_2cac +
                      fStack_3bc * fStack_2c4c +
                      fStack_35c * fStack_2bec +
                      fStack_2fc * fStack_2b8c +
                      fStack_29c * fStack_2b2c +
                      fStack_23c * fStack_2acc + fStack_1dc * fStack_2a6c + fStack_20c,
                      fStack_4e0 * fStack_2d70 +
                      fStack_480 * fStack_2d10 +
                      fStack_420 * fStack_2cb0 +
                      fStack_3c0 * fStack_2c50 +
                      fStack_360 * fStack_2bf0 +
                      fStack_300 * fStack_2b90 +
                      fStack_2a0 * fStack_2b30 +
                      fStack_240 * fStack_2ad0 + fStack_1e0 * fStack_2a70 + fStack_210);
        local_2e98 = (float)uVar21;
        fStack_2e94 = (float)((ulong)uVar21 >> 0x20);
        fStack_2e90 = (float)uVar22;
        fStack_2e8c = (float)((ulong)uVar22 >> 0x20);
        local_2fb8 = (float)uVar23;
        fStack_2fb4 = (float)((ulong)uVar23 >> 0x20);
        fStack_2fb0 = (float)uVar24;
        fStack_2fac = (float)((ulong)uVar24 >> 0x20);
        local_30d8 = (float)uVar25;
        fStack_30d4 = (float)((ulong)uVar25 >> 0x20);
        fStack_30d0 = (float)uVar26;
        fStack_30cc = (float)((ulong)uVar26 >> 0x20);
        local_39a8[2] =
             CONCAT44(fStack_4e4 * fStack_30d4 +
                      fStack_484 * fStack_2d74 +
                      fStack_424 * fStack_2d14 +
                      fStack_3c4 * fStack_2fb4 +
                      fStack_364 * fStack_2c54 +
                      fStack_304 * fStack_2bf4 +
                      fStack_2a4 * fStack_2e94 +
                      fStack_244 * fStack_2b34 + fStack_1e4 * fStack_2ad4 + fStack_214,
                      local_4e8 * local_30d8 +
                      local_488 * local_2d78 +
                      local_428 * local_2d18 +
                      local_3c8 * local_2fb8 +
                      local_368 * local_2c58 +
                      local_308 * local_2bf8 +
                      local_2a8 * local_2e98 +
                      local_248 * local_2b38 + local_1e8 * local_2ad8 + local_218);
        local_39a8[3] =
             CONCAT44(fStack_4dc * fStack_30cc +
                      fStack_47c * fStack_2d6c +
                      fStack_41c * fStack_2d0c +
                      fStack_3bc * fStack_2fac +
                      fStack_35c * fStack_2c4c +
                      fStack_2fc * fStack_2bec +
                      fStack_29c * fStack_2e8c +
                      fStack_23c * fStack_2b2c + fStack_1dc * fStack_2acc + fStack_20c,
                      fStack_4e0 * fStack_30d0 +
                      fStack_480 * fStack_2d70 +
                      fStack_420 * fStack_2d10 +
                      fStack_3c0 * fStack_2fb0 +
                      fStack_360 * fStack_2c50 +
                      fStack_300 * fStack_2bf0 +
                      fStack_2a0 * fStack_2e90 +
                      fStack_240 * fStack_2b30 + fStack_1e0 * fStack_2ad0 + fStack_210);
        local_39f8 = local_39f8 + 4;
        local_3a00 = local_3a00 + 4;
        local_3a08 = local_3a08 + 4;
        local_39a8 = local_39a8 + 4;
      }
      for (; local_3aa0 < iVar1; local_3aa0 = local_3aa0 + 1) {
        local_3138 = (float)*local_39f8;
        fStack_3134 = (float)((ulong)*local_39f8 >> 0x20);
        fStack_3130 = (float)local_39f8[1];
        fStack_312c = (float)((ulong)local_39f8[1] >> 0x20);
        local_3198 = (float)local_39f8[2];
        fStack_3194 = (float)((ulong)local_39f8[2] >> 0x20);
        fStack_3190 = (float)local_39f8[3];
        fStack_318c = (float)((ulong)local_39f8[3] >> 0x20);
        local_31f8 = (float)local_39f8[4];
        fStack_31f4 = (float)((ulong)local_39f8[4] >> 0x20);
        fStack_31f0 = (float)local_39f8[5];
        fStack_31ec = (float)((ulong)local_39f8[5] >> 0x20);
        local_3258 = (float)*local_3a00;
        fStack_3254 = (float)((ulong)*local_3a00 >> 0x20);
        fStack_3250 = (float)local_3a00[1];
        fStack_324c = (float)((ulong)local_3a00[1] >> 0x20);
        local_32b8 = (float)local_3a00[2];
        fStack_32b4 = (float)((ulong)local_3a00[2] >> 0x20);
        fStack_32b0 = (float)local_3a00[3];
        fStack_32ac = (float)((ulong)local_3a00[3] >> 0x20);
        local_3318 = (float)local_3a00[4];
        fStack_3314 = (float)((ulong)local_3a00[4] >> 0x20);
        fStack_3310 = (float)local_3a00[5];
        fStack_330c = (float)((ulong)local_3a00[5] >> 0x20);
        local_3378 = (float)*local_3a08;
        fStack_3374 = (float)((ulong)*local_3a08 >> 0x20);
        fStack_3370 = (float)local_3a08[1];
        fStack_336c = (float)((ulong)local_3a08[1] >> 0x20);
        local_33d8 = (float)local_3a08[2];
        fStack_33d4 = (float)((ulong)local_3a08[2] >> 0x20);
        fStack_33d0 = (float)local_3a08[3];
        fStack_33cc = (float)((ulong)local_3a08[3] >> 0x20);
        local_3438 = (float)local_3a08[4];
        fStack_3434 = (float)((ulong)local_3a08[4] >> 0x20);
        fStack_3430 = (float)local_3a08[5];
        fStack_342c = (float)((ulong)local_3a08[5] >> 0x20);
        *local_39a8 = CONCAT44(fStack_4e4 * fStack_3434 +
                               fStack_484 * fStack_33d4 +
                               fStack_424 * fStack_3374 +
                               fStack_3c4 * fStack_3314 +
                               fStack_364 * fStack_32b4 +
                               fStack_304 * fStack_3254 +
                               fStack_2a4 * fStack_31f4 +
                               fStack_244 * fStack_3194 + fStack_1e4 * fStack_3134 + fStack_214,
                               local_4e8 * local_3438 +
                               local_488 * local_33d8 +
                               local_428 * local_3378 +
                               local_3c8 * local_3318 +
                               local_368 * local_32b8 +
                               local_308 * local_3258 +
                               local_2a8 * local_31f8 +
                               local_248 * local_3198 + local_1e8 * local_3138 + local_218);
        local_39a8[1] =
             CONCAT44(fStack_4dc * fStack_342c +
                      fStack_47c * fStack_33cc +
                      fStack_41c * fStack_336c +
                      fStack_3bc * fStack_330c +
                      fStack_35c * fStack_32ac +
                      fStack_2fc * fStack_324c +
                      fStack_29c * fStack_31ec +
                      fStack_23c * fStack_318c + fStack_1dc * fStack_312c + fStack_20c,
                      fStack_4e0 * fStack_3430 +
                      fStack_480 * fStack_33d0 +
                      fStack_420 * fStack_3370 +
                      fStack_3c0 * fStack_3310 +
                      fStack_360 * fStack_32b0 +
                      fStack_300 * fStack_3250 +
                      fStack_2a0 * fStack_31f0 +
                      fStack_240 * fStack_3190 + fStack_1e0 * fStack_3130 + fStack_210);
        local_39f8 = local_39f8 + 2;
        local_3a00 = local_3a00 + 2;
        local_3a08 = local_3a08 + 2;
        local_39a8 = local_39a8 + 2;
      }
      local_39f8 = local_39f8 + 4;
      local_3a00 = local_3a00 + 4;
      local_3a08 = local_3a08 + 4;
    }
  }
  return;
}

Assistant:

static void convdw3x3s1_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + g * 4) : _mm_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m128 _k00 = _mm_load_ps(k0);
        __m128 _k01 = _mm_load_ps(k0 + 4);
        __m128 _k02 = _mm_load_ps(k0 + 8);
        __m128 _k10 = _mm_load_ps(k0 + 12);
        __m128 _k11 = _mm_load_ps(k0 + 16);
        __m128 _k12 = _mm_load_ps(k0 + 20);
        __m128 _k20 = _mm_load_ps(k0 + 24);
        __m128 _k21 = _mm_load_ps(k0 + 28);
        __m128 _k22 = _mm_load_ps(k0 + 32);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 7 < outw; j += 8)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r24, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r05 = _mm_load_ps(r0 + 20);
                __m128 _r15 = _mm_load_ps(r1 + 20);
                __m128 _r25 = _mm_load_ps(r2 + 20);
                _mm_store_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r25, _sum3);

                __m128 _sum4 = _bias0;
                __m128 _r06 = _mm_load_ps(r0 + 24);
                __m128 _r16 = _mm_load_ps(r1 + 24);
                __m128 _r26 = _mm_load_ps(r2 + 24);
                _mm_store_ps(outptr0 + 12, _sum3);

                _sum4 = _mm_comp_fmadd_ps(_k00, _r04, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k01, _r05, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k02, _r06, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k10, _r14, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k11, _r15, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k12, _r16, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k20, _r24, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k21, _r25, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k22, _r26, _sum4);

                __m128 _sum5 = _bias0;
                __m128 _r07 = _mm_load_ps(r0 + 28);
                __m128 _r17 = _mm_load_ps(r1 + 28);
                __m128 _r27 = _mm_load_ps(r2 + 28);
                _mm_store_ps(outptr0 + 16, _sum4);

                _sum5 = _mm_comp_fmadd_ps(_k00, _r05, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k01, _r06, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k02, _r07, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k10, _r15, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k11, _r16, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k12, _r17, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k20, _r25, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k21, _r26, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k22, _r27, _sum5);

                __m128 _sum6 = _bias0;
                __m128 _r08 = _mm_load_ps(r0 + 32);
                __m128 _r18 = _mm_load_ps(r1 + 32);
                __m128 _r28 = _mm_load_ps(r2 + 32);
                _mm_store_ps(outptr0 + 20, _sum5);

                _sum6 = _mm_comp_fmadd_ps(_k00, _r06, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k01, _r07, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k02, _r08, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k10, _r16, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k11, _r17, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k12, _r18, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k20, _r26, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k21, _r27, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k22, _r28, _sum6);

                __m128 _sum7 = _bias0;
                __m128 _r09 = _mm_load_ps(r0 + 36);
                __m128 _r19 = _mm_load_ps(r1 + 36);
                __m128 _r29 = _mm_load_ps(r2 + 36);
                _mm_store_ps(outptr0 + 24, _sum6);

                _sum7 = _mm_comp_fmadd_ps(_k00, _r07, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k01, _r08, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k02, _r09, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k10, _r17, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k11, _r18, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k12, _r19, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k20, _r27, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k21, _r28, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k22, _r29, _sum7);
                _mm_store_ps(outptr0 + 28, _sum7);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 3 < outw; j += 4)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r24, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r05 = _mm_load_ps(r0 + 20);
                __m128 _r15 = _mm_load_ps(r1 + 20);
                __m128 _r25 = _mm_load_ps(r2 + 20);
                _mm_store_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm_store_ps(outptr0 + 12, _sum3);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm_store_ps(outptr0 + 4, _sum1);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm_store_ps(outptr0, _sum0);

                r0 += 4;
                r1 += 4;
                r2 += 4;
                outptr0 += 4;
            }

            r0 += 2 * 4;
            r1 += 2 * 4;
            r2 += 2 * 4;
        }
    }
}